

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
          *handler)

{
  internal *end;
  internal *end_00;
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  ulong uVar5;
  internal *piVar6;
  internal *piVar7;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *this_00;
  wchar_t wVar8;
  char *message;
  long lVar9;
  internal *piVar10;
  bool bVar11;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
             *)format_str.size_;
  end_00 = this + (long)format_str.data_ * 4;
  do {
    if (this == end_00) {
      return;
    }
    piVar7 = this;
    if (*(wchar_t *)this == L'{') {
LAB_0020020c:
      piVar10 = this;
      if (this != piVar7) {
        do {
          bVar11 = piVar10 != piVar7;
          piVar6 = piVar10;
          if (bVar11) {
            iVar1 = *(int *)piVar10;
            while (iVar1 != 0x7d) {
              piVar6 = piVar6 + 4;
              bVar11 = piVar6 != piVar7;
              if (piVar6 == piVar7) goto LAB_0020024a;
              iVar1 = *(int *)piVar6;
            }
            bVar11 = true;
          }
LAB_0020024a:
          if (bVar11) {
            end = piVar6 + 4;
            if ((end == piVar7) || (*(wchar_t *)end != L'}')) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
              goto LAB_00200291;
            }
            format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
            ::on_text(this_00,(wchar_t *)piVar10,(wchar_t *)end);
            piVar10 = piVar6 + 8;
            bVar11 = true;
          }
          else {
            format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
            ::on_text(this_00,(wchar_t *)piVar10,(wchar_t *)piVar7);
LAB_00200291:
            bVar11 = false;
          }
        } while (bVar11);
      }
      piVar7 = piVar7 + 4;
      if (piVar7 == end_00) {
        message = "invalid format string";
        goto LAB_002002e8;
      }
      if ((char)*(int *)piVar7 == '}') {
        basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>
        ::next_arg((format_arg *)&local_58.string,&this_00->context);
        (this_00->arg).type_ = local_48;
        (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
        (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_002002ce:
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
        ::on_replacement_field(this_00,(wchar_t *)piVar7);
      }
      else {
        if (*(int *)piVar7 != 0x7b) {
          local_58._0_8_ = this_00;
          piVar7 = (internal *)
                   parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>&,wchar_t>>
                             ((wchar_t *)piVar7,(wchar_t *)end_00,
                              (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_&,_wchar_t>
                               *)&local_58.string);
          if (piVar7 == end_00) {
            wVar8 = L'\0';
          }
          else {
            wVar8 = *(wchar_t *)piVar7;
          }
          if (wVar8 == L':') {
            piVar7 = (internal *)
                     format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                     ::on_format_specs(this_00,(wchar_t *)(piVar7 + 4),(wchar_t *)end_00);
            if ((piVar7 != end_00) && (*(wchar_t *)piVar7 == L'}')) goto LAB_002003e2;
            message = "unknown format specifier";
          }
          else {
            if (wVar8 == L'}') goto LAB_002002ce;
            message = "missing \'}\' in format string";
          }
LAB_002002e8:
          error_handler::on_error((error_handler *)this_00,message);
          goto LAB_0020037a;
        }
        pwVar3 = (this_00->context).
                 super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                 .out_.super_truncating_iterator_base<wchar_t_*>.out_;
        uVar4 = (this_00->context).
                super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                .out_.super_truncating_iterator_base<wchar_t_*>.limit_;
        uVar5 = (this_00->context).
                super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                .out_.super_truncating_iterator_base<wchar_t_*>.count_;
        wVar8 = *(wchar_t *)piVar7;
        if (uVar5 < uVar4) {
          wVar2 = (this_00->context).
                  super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                  .out_.blackhole_;
          *pwVar3 = wVar8;
          lVar9 = 4;
          wVar8 = wVar2;
        }
        else {
          lVar9 = 0;
        }
        (this_00->context).
        super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
        .out_.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)((long)pwVar3 + lVar9);
        (this_00->context).
        super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
        .out_.super_truncating_iterator_base<wchar_t_*>.limit_ = uVar4;
        (this_00->context).
        super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
        .out_.super_truncating_iterator_base<wchar_t_*>.count_ = uVar5 + 1;
        (this_00->context).
        super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
        .out_.blackhole_ = wVar8;
      }
LAB_002003e2:
      this = piVar7 + 4;
      bVar11 = true;
    }
    else {
      bVar11 = true;
      wVar8 = *(wchar_t *)this;
      while (wVar8 != L'{') {
        piVar7 = piVar7 + 4;
        bVar11 = piVar7 != end_00;
        if (piVar7 == end_00) break;
        wVar8 = *(wchar_t *)piVar7;
      }
      piVar10 = this;
      if (bVar11) goto LAB_0020020c;
      do {
        bVar11 = piVar10 != end_00;
        piVar7 = piVar10;
        if (bVar11) {
          wVar8 = *(wchar_t *)piVar10;
          while (wVar8 != L'}') {
            piVar7 = piVar7 + 4;
            bVar11 = piVar7 != end_00;
            if (piVar7 == end_00) goto LAB_00200329;
            wVar8 = *(wchar_t *)piVar7;
          }
          bVar11 = true;
        }
LAB_00200329:
        if (bVar11) {
          piVar6 = piVar7 + 4;
          if ((piVar6 == end_00) || (*(wchar_t *)piVar6 != L'}')) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_00200370;
          }
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar10,(wchar_t *)piVar6);
          piVar10 = piVar7 + 8;
          bVar11 = true;
        }
        else {
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar10,(wchar_t *)end_00);
LAB_00200370:
          bVar11 = false;
        }
      } while (bVar11);
LAB_0020037a:
      bVar11 = false;
    }
    if (!bVar11) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}